

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int create_labelmap(string *file_name)

{
  char cVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  int unaff_EBP;
  string line;
  string outfile_name;
  ofstream outfile;
  ifstream myReadFile;
  char *local_4a0;
  long local_498;
  char local_490 [16];
  long local_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 local_468 [16];
  char *local_458;
  long local_450;
  char local_448 [16];
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"/newdataset/obj.names","");
  std::ofstream::ofstream(&local_438,(string *)&local_458,_S_out);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)file_name);
  local_478 = local_468;
  local_470 = 0;
  local_468[0] = 0;
  while( true ) {
    cVar2 = (char)(string *)local_238;
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_478,cVar1);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::substr((ulong)&local_4a0,(ulong)&local_478);
    iVar3 = std::__cxx11::string::compare((char *)&local_4a0);
    if (local_4a0 != local_490) {
      operator_delete(local_4a0);
    }
    if (iVar3 == 0) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_478,cVar1);
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_478,cVar2);
      std::__cxx11::string::substr((ulong)&local_4a0,(ulong)&local_478);
      iVar3 = std::__cxx11::string::compare((char *)&local_4a0);
      if (local_4a0 != local_490) {
        operator_delete(local_4a0);
      }
      if (iVar3 == 0) {
        lVar5 = std::__cxx11::string::find((char *)&local_478,0x1040d4,0);
        if (lVar5 != -1) {
          do {
            lVar6 = lVar5;
            lVar5 = std::__cxx11::string::find((char *)&local_478,0x1040d4,lVar6 + 1);
          } while (lVar5 != -1);
          unaff_EBP = (int)lVar6 + -8;
        }
        std::__cxx11::string::substr((ulong)&local_4a0,(ulong)&local_478);
        local_480 = (long)unaff_EBP;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_4a0,local_498);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_4a0 != local_490) {
          operator_delete(local_4a0);
        }
        std::__cxx11::string::substr((ulong)&local_4a0,(ulong)&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_438,local_4a0,local_498);
        if (local_4a0 != local_490) {
          operator_delete(local_4a0);
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_458,local_450);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_438 + -0x18) + (char)&local_438);
        std::ostream::put((char)&local_438);
        std::ostream::flush();
      }
    }
  }
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  uVar8 = std::ofstream::close();
  local_438 = _VTT;
  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_430);
  std::ios_base::~ios_base(local_340);
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

int create_labelmap(string file_name)
{

    string outfile_name = objnames;
    //string outfile_name = labels_voc.substr(0, labels_voc.size()-9) + "obj.names";
    //cout << outfile_name << endl;

    std::ofstream outfile (outfile_name, std::ofstream::out);

    ifstream myReadFile;
    myReadFile.open(file_name);

    for( std::string line; getline( myReadFile, line ); )
    {
        if (line.substr(0,6) == "item {")
        {
            getline( myReadFile, line );
            getline( myReadFile, line );

            int pos_f, pos_i =8;
            if (line.substr(1,6) == "name: ")
            {
                // Find delimiter '
                for(size_t pos=line.find("'",0); pos!=std::string::npos; pos=line.find("'",pos+1))
                    pos_f = pos-pos_i;

                cout << line.substr(pos_i,pos_f) << endl;
                outfile << line.substr(pos_i,pos_f);
                cout << outfile_name << endl;
                outfile << endl;
            }
        }
    }
    outfile.close();
}